

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_> *
Utils::fillItemIdList
          (vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
           *__return_storage_ptr__,int count,const_iterator it)

{
  uchar *__last;
  uint uVar1;
  ItemIDList itemIdList;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (; 0 < count; count = count - uVar1) {
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    __last = it._M_current + 2;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (it._M_current,__last,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78
              );
    std::
    __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (local_78,uStack_70);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
    uVar1 = *local_48._M_impl.super__Vector_impl_data._M_start << 8 |
            local_48._M_impl.super__Vector_impl_data._M_start[1];
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    it._M_current = __last + (long)(int)uVar1 + -2;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last,it._M_current,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&uStack_60);
    std::
    __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (uStack_60,local_58);
    std::vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>::
    push_back(__return_storage_ptr__,(value_type *)&local_78);
    LinkTargetIDList::ItemIDList::~ItemIDList((ItemIDList *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<LinkTargetIDList::ItemIDList> Utils::fillItemIdList(int count, std::vector<unsigned char>::const_iterator it) {
    std::vector<LinkTargetIDList::ItemIDList> IDList;
    while (count > 0) {
        LinkTargetIDList::ItemIDList itemIdList;
        copy(it, it + 2, std::back_inserter(itemIdList.ItemIDSize));          // 2 byte
        it = it + 2;
        reverse(itemIdList.ItemIDSize.begin(), itemIdList.ItemIDSize.end());
        int itemIDSize = Utils::lenTwoBytes(itemIdList.ItemIDSize);

        copy(it, it + itemIDSize - 2, std::back_inserter(itemIdList.Data));       // itemIDSize byte
        reverse(itemIdList.Data.begin(), itemIdList.Data.end());
        it = it + itemIDSize - 2;

        IDList.push_back(itemIdList);
        count = count - itemIDSize;
    }
    return IDList;
}